

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3e7fa::adjustTableSize
          (anon_unknown_dwarf_3e7fa *this,Module *wasm,int initialSize,bool secondary)

{
  long lVar1;
  ulong uVar2;
  undefined1 local_198 [392];
  
  if (initialSize < 0) {
    return;
  }
  if ((Module *)this == wasm) {
    if (secondary) {
      return;
    }
    ::wasm::Fatal::Fatal((Fatal *)local_198);
    ::wasm::Fatal::operator<<
              ((Fatal *)local_198,(char (*) [43])"--initial-table used but there is no table");
  }
  else {
    uVar2 = (ulong)(uint)initialSize;
    lVar1 = *(long *)this;
    if (uVar2 < *(ulong *)(lVar1 + 0x38)) {
      ::wasm::Fatal::Fatal((Fatal *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 0x10),
                 "Specified initial table size too small, should be at least ",0x3b);
      ::wasm::Fatal::operator<<((Fatal *)local_198,(Address *)(*(long *)this + 0x38));
    }
    else {
      if (uVar2 <= *(ulong *)(lVar1 + 0x40)) {
        *(ulong *)(lVar1 + 0x38) = uVar2;
        return;
      }
      ::wasm::Fatal::Fatal((Fatal *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_198 + 0x10),
                 "Specified initial table size larger than max table size ",0x38);
      ::wasm::Fatal::operator<<((Fatal *)local_198,(Address *)(*(long *)this + 0x40));
    }
  }
  ::wasm::Fatal::~Fatal((Fatal *)local_198);
}

Assistant:

void adjustTableSize(Module& wasm, int initialSize, bool secondary = false) {
  if (initialSize < 0) {
    return;
  }
  if (wasm.tables.empty()) {
    if (secondary) {
      // It's not a problem if the table is not used in the secondary module.
      return;
    }
    Fatal() << "--initial-table used but there is no table";
  }

  auto& table = wasm.tables.front();

  if ((uint64_t)initialSize < table->initial) {
    Fatal() << "Specified initial table size too small, should be at least "
            << table->initial;
  }
  if ((uint64_t)initialSize > table->max) {
    Fatal() << "Specified initial table size larger than max table size "
            << table->max;
  }
  table->initial = initialSize;
}